

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_LBackward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  char cVar1;
  long lVar2;
  complex<double> **ppcVar3;
  complex<double> *pcVar4;
  double dVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  complex<double> *pcVar7;
  long lVar8;
  int64_t j;
  long col;
  complex<double> *__x;
  complex<double> *pcVar9;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  complex<double> val;
  
  lVar2 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar6 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (((lVar2 != CONCAT44(extraout_var,iVar6)) ||
      (cVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed,
      cVar1 == '\x03')) || (cVar1 == '\0')) {
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Subst_LBackward(TPZFMatrix<TVar> *) const [TVar = std::complex<double>]"
               ,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
  }
  iVar6 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  lVar2 = CONCAT44(extraout_var_00,iVar6);
  while (lVar8 = lVar2, 1 < lVar8) {
    lVar2 = lVar8 + -1;
    for (col = 0; col < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
        col = col + 1) {
      ppcVar3 = (this->fElem).fStore;
      __x = ppcVar3[lVar2];
      pcVar4 = ppcVar3[lVar8];
      pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(B,lVar2,col);
      val._M_value._0_8_ = *(undefined8 *)pcVar7->_M_value;
      val._M_value._8_8_ = *(undefined8 *)(pcVar7->_M_value + 8);
      while( true ) {
        __x = __x + 1;
        pcVar9 = pcVar7 + -1;
        if (pcVar4 <= __x) break;
        std::operator*(__x,&val);
        dVar5 = *(double *)(pcVar7[-1]._M_value + 8);
        *(double *)pcVar9->_M_value = *(double *)pcVar9->_M_value - extraout_XMM0_Qa;
        *(double *)(pcVar7[-1]._M_value + 8) = dVar5 - in_XMM1_Qa;
        pcVar7 = pcVar9;
      }
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed || this->fDecomposed == ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
    
    int64_t Dimension = this->Dim();
    for ( int64_t k = Dimension-1; k > 0; k-- ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            //		TVar val = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            // substract the column of the skyline matrix from the vector.
            
            TVar val = *BPtr;
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    return( 1 );
}